

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O0

void __thiscall trng::xoshiro256plus::step(xoshiro256plus *this)

{
  result_type rVar1;
  result_type t;
  xoshiro256plus *this_local;
  
  rVar1 = (this->S).r[1];
  (this->S).r[2] = (this->S).r[0] ^ (this->S).r[2];
  (this->S).r[3] = (this->S).r[1] ^ (this->S).r[3];
  (this->S).r[1] = (this->S).r[2] ^ (this->S).r[1];
  (this->S).r[0] = (this->S).r[3] ^ (this->S).r[0];
  (this->S).r[2] = rVar1 << 0x11 ^ (this->S).r[2];
  (this->S).r[3] = (this->S).r[3] << 0x2d | (this->S).r[3] >> 0x13;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void xoshiro256plus::step() {
    const result_type t{S.r[1] << 17};
    S.r[2] ^= S.r[0];
    S.r[3] ^= S.r[1];
    S.r[1] ^= S.r[2];
    S.r[0] ^= S.r[3];
    S.r[2] ^= t;
    S.r[3] = (S.r[3] << 45) | (S.r[3] >> (64 - 45));
  }